

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharacterSet.cpp
# Opt level: O3

string * __thiscall
ZXing::NormalizeName_abi_cxx11_(string *__return_storage_ptr__,ZXing *this,string_view sv)

{
  char cVar1;
  size_type sVar2;
  ulong uVar3;
  int iVar4;
  void *pvVar5;
  char *pcVar6;
  char *pcVar7;
  size_type sVar8;
  char *pcVar9;
  long lVar10;
  char *pcVar11;
  char *pcVar12;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,sv._M_len,this + sv._M_len,sv._M_str);
  pcVar11 = (__return_storage_ptr__->_M_dataplus)._M_p;
  sVar2 = __return_storage_ptr__->_M_string_length;
  pcVar9 = pcVar11;
  pcVar7 = pcVar11;
  if (sVar2 != 0) {
    sVar8 = 0;
    do {
      iVar4 = tolower((int)pcVar11[sVar8]);
      pcVar11[sVar8] = (char)iVar4;
      sVar8 = sVar8 + 1;
    } while (sVar2 != sVar8);
    pcVar11 = (__return_storage_ptr__->_M_dataplus)._M_p;
    uVar3 = __return_storage_ptr__->_M_string_length;
    pcVar7 = pcVar11 + uVar3;
    pcVar9 = pcVar11;
    if (0 < (long)uVar3 >> 2) {
      pcVar9 = pcVar11 + (uVar3 & 0xfffffffffffffffc);
      lVar10 = ((long)uVar3 >> 2) + 1;
      pcVar6 = pcVar11 + 3;
      do {
        pvVar5 = memchr("_-[] ",(int)pcVar6[-3],6);
        pcVar12 = pcVar7;
        if (pvVar5 != (void *)0x0) {
          pcVar6 = pcVar6 + -3;
          goto LAB_0013290c;
        }
        pvVar5 = memchr("_-[] ",(int)pcVar6[-2],6);
        if (pvVar5 != (void *)0x0) {
          pcVar6 = pcVar6 + -2;
          goto LAB_0013290c;
        }
        pvVar5 = memchr("_-[] ",(int)pcVar6[-1],6);
        if (pvVar5 != (void *)0x0) {
          pcVar6 = pcVar6 + -1;
          goto LAB_0013290c;
        }
        pvVar5 = memchr("_-[] ",(int)*pcVar6,6);
        if (pvVar5 != (void *)0x0) goto LAB_0013290c;
        lVar10 = lVar10 + -1;
        pcVar6 = pcVar6 + 4;
      } while (1 < lVar10);
    }
  }
  lVar10 = (long)pcVar7 - (long)pcVar9;
  pcVar12 = pcVar7;
  if (lVar10 == 1) {
LAB_001328d2:
    pvVar5 = memchr("_-[] ",(int)*pcVar9,6);
    pcVar6 = pcVar9;
    if (pvVar5 == (void *)0x0) {
      pcVar6 = pcVar7;
    }
  }
  else if (lVar10 == 2) {
LAB_001328b4:
    pvVar5 = memchr("_-[] ",(int)*pcVar9,6);
    pcVar6 = pcVar9;
    if (pvVar5 == (void *)0x0) {
      pcVar9 = pcVar9 + 1;
      goto LAB_001328d2;
    }
  }
  else {
    if (lVar10 != 3) goto LAB_00132953;
    pvVar5 = memchr("_-[] ",(int)*pcVar9,6);
    pcVar6 = pcVar9;
    if (pvVar5 == (void *)0x0) {
      pcVar9 = pcVar9 + 1;
      goto LAB_001328b4;
    }
  }
LAB_0013290c:
  pcVar9 = pcVar6 + 1;
  pcVar7 = pcVar6;
  if (pcVar9 != pcVar12 && pcVar6 != pcVar12) {
    do {
      cVar1 = *pcVar9;
      pvVar5 = memchr("_-[] ",(int)cVar1,6);
      if (pvVar5 == (void *)0x0) {
        *pcVar6 = cVar1;
        pcVar6 = pcVar6 + 1;
      }
      pcVar9 = pcVar9 + 1;
    } while (pcVar9 != pcVar12);
    pcVar11 = (__return_storage_ptr__->_M_dataplus)._M_p;
    pcVar7 = pcVar6;
  }
LAB_00132953:
  __return_storage_ptr__->_M_string_length = (size_type)(pcVar7 + -(long)pcVar11);
  *pcVar7 = '\0';
  return (string *)(pcVar7 + -(long)pcVar11);
}

Assistant:

static std::string NormalizeName(std::string_view sv)
{
	std::string str(sv);
	std::transform(str.begin(), str.end(), str.begin(), [](char c) { return (char)std::tolower(c); });
	str.erase(std::remove_if(str.begin(), str.end(), [](char c) { return Contains("_-[] ", c); }), str.end());
	return str;
}